

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

shared_ptr<chrono::curiosity::CuriosityWheel> __thiscall
chrono::curiosity::Curiosity::GetWheel(Curiosity *this,CuriosityWheelID id)

{
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::curiosity::CuriosityWheel> sVar1;
  
  std::__shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2> *)
             (CONCAT44(in_register_00000034,id) + 0x20 + (in_RDX & 0xffffffff) * 0x10));
  sVar1.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::curiosity::CuriosityWheel>)
         sVar1.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CuriosityWheel> Curiosity::GetWheel(CuriosityWheelID id) const {
    return m_wheels[id];
}